

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void SubtractionHelper<unsigned_int,long,6>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,long *rhs,uint *result)

{
  uint uVar1;
  ulong uVar2;
  int *in_RDX;
  ulong *in_RSI;
  uint *in_RDI;
  uint64_t tmp;
  
  if ((long)*in_RSI < 0) {
    uVar2 = (ulong)*in_RDI + (*in_RSI ^ 0xffffffffffffffff) + 1;
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 < uVar2) goto LAB_001c8dfa;
    *in_RDX = (int)uVar2;
  }
  else {
    if ((ulong)*in_RDI < *in_RSI) {
LAB_001c8dfa:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDI - (int)*in_RSI;
  }
  return;
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}